

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.h
# Opt level: O1

bool __thiscall llvm::StringRef::consume_front(StringRef *this,StringRef Prefix)

{
  ulong uVar1;
  int iVar2;
  ulong __n;
  bool bVar3;
  
  __n = Prefix.Length;
  uVar1 = this->Length;
  if (uVar1 < __n) {
    bVar3 = false;
  }
  else if (__n == 0) {
    bVar3 = true;
  }
  else {
    iVar2 = bcmp(this->Data,Prefix.Data,__n);
    bVar3 = iVar2 == 0;
  }
  if (bVar3 != false) {
    if (uVar1 < __n) {
      __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                    ,0x281,"StringRef llvm::StringRef::drop_front(size_t) const");
    }
    this->Data = this->Data + __n;
    this->Length = uVar1 - __n;
  }
  return bVar3;
}

Assistant:

bool consume_front(StringRef Prefix) {
      if (!startswith(Prefix))
        return false;

      *this = drop_front(Prefix.size());
      return true;
    }